

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O3

void __thiscall CProfileNode::Call(CProfileNode *this)

{
  int iVar1;
  timeval currentTime;
  timeval local_20;
  
  this->TotalCalls = this->TotalCalls + 1;
  iVar1 = this->RecursionCounter;
  this->RecursionCounter = iVar1 + 1;
  if (iVar1 != 0) {
    return;
  }
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  this->StartTime =
       (local_20.tv_usec - ((gProfileClock.m_data)->mStartTime).tv_usec) +
       (local_20.tv_sec - ((gProfileClock.m_data)->mStartTime).tv_sec) * 1000000;
  return;
}

Assistant:

void	CProfileNode::Call( void )
{
	TotalCalls++;
	if (RecursionCounter++ == 0) {
		Profile_Get_Ticks(&StartTime);
	}
}